

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O0

void __thiscall
libtorrent::aux::torrent::on_piece_verified
          (torrent *this,vector<sha256_hash> *block_hashes,piece_index_t piece,sha1_hash *piece_hash
          ,storage_error *error)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  pointer ppVar4;
  session_settings *this_00;
  torrent_info *this_01;
  info_hash_t *this_02;
  element_type *peVar5;
  char *local_1d8;
  char *local_1d0;
  bool local_1bb;
  vector<int,_std::allocator<int>_> local_178;
  piece_index_t local_154;
  value_t local_150;
  value_t local_14c;
  value_t local_148;
  tribool local_144;
  tribool local_140;
  int local_13c;
  int local_138;
  value_t local_134;
  value_t local_130;
  tribool local_12c;
  int local_128;
  int local_124;
  value_t local_120;
  value_t local_11c;
  value_t local_118;
  tribool local_114;
  tribool local_110;
  value_t local_10c;
  value_t local_108;
  tribool local_104;
  string_view local_100;
  value_t local_ec;
  value_t local_e8;
  value_t local_e4;
  tribool local_e0;
  tribool local_dc;
  bool local_d5;
  int local_d4;
  value_t vStack_d0;
  bool disk_error;
  value_t local_cc;
  value_t local_c8;
  value_t local_c4;
  value_t local_c0;
  value_t local_bc;
  tribool local_b8;
  tribool local_b4;
  value_t local_b0;
  tribool local_ac;
  span<const_libtorrent::digest32<256L>_> local_a8;
  piece_index_t local_98;
  value_t local_94;
  int local_90;
  sha1_hash local_8c;
  digest32<160L> local_78;
  tribool local_58;
  tribool local_54;
  tribool local_50;
  tribool local_4c;
  tribool local_48;
  tribool v2_passed;
  tribool passed;
  storage_error *error_local;
  sha1_hash *piece_hash_local;
  vector<sha256_hash> *block_hashes_local;
  torrent *this_local;
  piece_index_t piece_local;
  
  if (((*(ulong *)&(this->super_torrent_hot_members).field_0x48 >> 0x1a & 1) == 0) &&
     ((*(uint *)&this->field_0x5dd >> 0x1a & 1) == 0)) {
    this_local._4_4_ = piece.m_val;
    ppVar4 = ::std::
             unique_ptr<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
             ::operator->(&(this->super_torrent_hot_members).m_picker);
    piece_picker::completed_hash_job(ppVar4,this_local._4_4_);
    boost::logic::tribool::tribool(&local_48,boost::logic::indeterminate);
    boost::logic::tribool::tribool(&local_4c,boost::logic::indeterminate);
    this_00 = settings(this);
    bVar1 = session_settings::get_bool(this_00,0x8016);
    if (bVar1) {
      boost::logic::tribool::tribool(&local_50,true);
      local_4c.value = local_50.value;
      local_48.value = local_50.value;
    }
    else {
      bVar1 = storage_error::operator_cast_to_bool(error);
      if (bVar1) {
        boost::logic::tribool::tribool(&local_54,false);
        local_4c.value = local_54.value;
        local_48.value = local_54.value;
      }
      else {
        this_01 = torrent_file(this);
        this_02 = torrent_info::info_hashes(this_01);
        bVar1 = info_hash_t::has_v1(this_02);
        if (bVar1) {
          local_78.m_number._M_elems[4] = (piece_hash->m_number)._M_elems[4];
          local_78.m_number._M_elems._0_8_ = *(undefined8 *)(piece_hash->m_number)._M_elems;
          local_78.m_number._M_elems._8_8_ = *(undefined8 *)((piece_hash->m_number)._M_elems + 2);
          peVar5 = ::std::
                   __shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)&(this->super_torrent_hot_members).m_torrent_file);
          local_90 = this_local._4_4_;
          torrent_info::hash_for_piece(&local_8c,peVar5,this_local._4_4_);
          bVar1 = digest32<160L>::operator==(&local_78,&local_8c);
          boost::logic::tribool::tribool(&local_58,bVar1);
          local_48.value = local_58.value;
        }
        bVar1 = ::std::
                vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>::
                empty(&block_hashes->
                       super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                     );
        if (!bVar1) {
          local_98.m_val = this_local._4_4_;
          span<libtorrent::digest32<256l>const>::
          span<libtorrent::aux::container_wrapper<libtorrent::digest32<256l>,int,std::vector<libtorrent::digest32<256l>,std::allocator<libtorrent::digest32<256l>>>>,libtorrent::digest32<256l>,void>
                    ((span<libtorrent::digest32<256l>const> *)&local_a8,block_hashes);
          local_94 = (value_t)on_blocks_hashed(this,local_98,local_a8);
          local_4c = (tribool)local_94;
        }
      }
    }
    bVar1 = storage_error::operator_cast_to_bool(error);
    local_b8.value = local_48.value;
    local_c0 = local_4c.value;
    local_bc = (value_t)boost::logic::operator!(local_4c);
    local_b4 = boost::logic::operator&&(local_b8,(tribool)local_bc);
    local_cc = local_48.value;
    local_c8 = (value_t)boost::logic::operator!(local_48);
    vStack_d0 = local_4c.value;
    local_c4 = (value_t)boost::logic::operator&&((tribool)local_c8,local_4c);
    local_b0 = (value_t)boost::logic::operator||(local_b4,(tribool)local_c4);
    local_ac = boost::logic::operator&&((bool)((bVar1 ^ 0xffU) & 1),(tribool)local_b0);
    bVar1 = boost::logic::tribool::operator_cast_to_bool(&local_ac);
    if (bVar1) {
      local_d4 = this_local._4_4_;
      handle_inconsistent_hashes(this,this_local._4_4_);
    }
    else {
      local_e4 = local_48.value;
      local_e0 = boost::logic::operator!(local_48);
      local_ec = local_4c.value;
      local_e8 = (value_t)boost::logic::operator!(local_4c);
      local_dc = boost::logic::operator||(local_e0,(tribool)local_e8);
      bVar1 = boost::logic::tribool::operator_cast_to_bool(&local_dc);
      local_1bb = false;
      if (bVar1) {
        local_1bb = storage_error::operator_cast_to_bool(error);
      }
      local_d5 = local_1bb;
      if (local_1bb != false) {
        ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_100,"piece_verified");
        handle_disk_error(this,local_100,error,(peer_connection *)0x0,none);
      }
      uVar2 = (*(this->super_request_callback)._vptr_request_callback[6])();
      if ((uVar2 & 1) != 0) {
        uVar2 = strong_typedef::operator_cast_to_int((strong_typedef *)((long)&this_local + 4));
        local_108 = local_48.value;
        local_10c = local_4c.value;
        local_104 = boost::logic::operator||(local_48,local_4c);
        bVar1 = boost::logic::tribool::operator_cast_to_bool(&local_104);
        if (bVar1) {
          local_1d0 = "passed";
        }
        else {
          if ((local_d5 & 1U) == 0) {
            local_118 = local_48.value;
            local_114 = boost::logic::operator!(local_48);
            local_120 = local_4c.value;
            local_11c = (value_t)boost::logic::operator!(local_4c);
            local_110 = boost::logic::operator||(local_114,(tribool)local_11c);
            bVar1 = boost::logic::tribool::operator_cast_to_bool(&local_110);
            local_1d8 = "-";
            if (bVar1) {
              local_1d8 = "failed";
            }
          }
          else {
            local_1d8 = "disk failed";
          }
          local_1d0 = local_1d8;
        }
        peVar5 = ::std::
                 __shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&(this->super_torrent_hot_members).m_torrent_file);
        local_124 = this_local._4_4_;
        uVar3 = torrent_info::piece_size(peVar5,this_local._4_4_);
        (*(this->super_request_callback)._vptr_request_callback[7])
                  (this,"*** PIECE_FINISHED [ p: %d | chk: %s | size: %d ]",(ulong)uVar2,local_1d0,
                   (ulong)uVar3);
      }
      bVar1 = has_picker(this);
      if ((bVar1) || ((*(ulong *)&(this->super_torrent_hot_members).field_0x48 >> 0x1e & 1) == 0)) {
        need_picker(this);
        state_updated(this);
        ppVar4 = ::std::
                 unique_ptr<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
                 ::operator->(&(this->super_torrent_hot_members).m_picker);
        local_128 = this_local._4_4_;
        bVar1 = piece_picker::is_piece_finished(ppVar4,this_local._4_4_);
        if (bVar1) {
          if ((local_d5 & 1U) == 0) {
            local_130 = local_48.value;
            local_134 = local_4c.value;
            local_12c = boost::logic::operator||(local_48,local_4c);
            bVar1 = boost::logic::tribool::operator_cast_to_bool(&local_12c);
            if (bVar1) {
              local_138 = this_local._4_4_;
              piece_passed(this,this_local._4_4_);
              if (((byte)this->field_0x5cc >> 2 & 1) != 0) {
                local_13c = this_local._4_4_;
                verified(this,this_local._4_4_);
              }
            }
            else {
              local_148 = local_48.value;
              local_144 = boost::logic::operator!(local_48);
              local_150 = local_4c.value;
              local_14c = (value_t)boost::logic::operator!(local_4c);
              local_140 = boost::logic::operator||(local_144,(tribool)local_14c);
              bVar1 = boost::logic::tribool::operator_cast_to_bool(&local_140);
              if (bVar1) {
                local_154.m_val = this_local._4_4_;
                local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start = (pointer)0x0;
                local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish = (pointer)0x0;
                local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                ::std::vector<int,_std::allocator<int>_>::vector(&local_178);
                piece_failed(this,local_154,&local_178);
                ::std::vector<int,_std::allocator<int>_>::~vector(&local_178);
              }
            }
          }
          else {
            update_gauge(this);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void torrent::on_piece_verified(aux::vector<sha256_hash> block_hashes
		, piece_index_t const piece
		, sha1_hash const& piece_hash, storage_error const& error) try
	{
		TORRENT_ASSERT(is_single_thread());

		if (m_abort) return;
		if (m_deleted) return;

		m_picker->completed_hash_job(piece);

		boost::tribool passed = boost::indeterminate;
		boost::tribool v2_passed = boost::indeterminate;

		if (settings().get_bool(settings_pack::disable_hash_checks))
		{
			passed = v2_passed = true;
		}
		else if (error)
		{
			passed = v2_passed = false;
		}
		else
		{
			if (torrent_file().info_hashes().has_v1())
			{
				passed = sha1_hash(piece_hash) == m_torrent_file->hash_for_piece(piece);
			}

			if (!block_hashes.empty())
			{
				TORRENT_ASSERT(torrent_file().info_hashes().has_v2());
				v2_passed = on_blocks_hashed(piece, block_hashes);
			}
		}

		if (!error && ((passed && !v2_passed) || (!passed && v2_passed)))
		{
			handle_inconsistent_hashes(piece);
			return;
		}

		bool const disk_error = (!passed || !v2_passed) && error;

		if (disk_error) handle_disk_error("piece_verified", error);

#ifndef TORRENT_DISABLE_LOGGING
		if (should_log())
		{
			debug_log("*** PIECE_FINISHED [ p: %d | chk: %s | size: %d ]"
				, static_cast<int>(piece)
				, (passed || v2_passed) ? "passed"
				: disk_error ? "disk failed"
				: (!passed || !v2_passed) ? "failed"
				: "-"
				, m_torrent_file->piece_size(piece));
		}
#endif
		TORRENT_ASSERT(valid_metadata());

		// if we're a seed we don't have a picker
		// and we also don't have to do anything because
		// we already have this piece
		if (!has_picker() && m_have_all) return;

		need_picker();

		TORRENT_ASSERT(!m_picker->have_piece(piece));

		state_updated();

		// even though the piece passed the hash-check
		// it might still have failed being written to disk
		// if so, piece_picker::write_failed() has been
		// called, and the piece is no longer finished.
		// in this case, we have to ignore the fact that
		// it passed the check
		if (!m_picker->is_piece_finished(piece)) return;

		if (disk_error)
		{
			update_gauge();
		}
		else if (passed || v2_passed)
		{
			// the following call may cause picker to become invalid
			// in case we just became a seed
			piece_passed(piece);
			// if we're in seed mode, we just acquired this piece
			// mark it as verified
			if (m_seed_mode) verified(piece);
		}
		else if (!passed || !v2_passed)
		{
			// piece_failed() will restore the piece
			piece_failed(piece);
		}
	}
	catch (...) { handle_exception(); }